

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateParser
          (ImmutableMessageGenerator *this,Printer *printer)

{
  ushort *puVar1;
  string_view text;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  puVar1 = (ushort *)(((this->super_MessageGenerator).descriptor_)->all_names_).payload_;
  local_10._M_len = (size_t)*puVar1;
  local_10._M_str = (char *)((long)puVar1 + ~local_10._M_len);
  text._M_str = 
  "private static final com.google.protobuf.Parser<$classname$>\n    PARSER = new com.google.protobuf.AbstractParser<$classname$>() {\n  @java.lang.Override\n  public $classname$ parsePartialFrom(\n      com.google.protobuf.CodedInputStream input,\n      com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n      throws com.google.protobuf.InvalidProtocolBufferException {\n    Builder builder = newBuilder();\n    try {\n      builder.mergeFrom(input, extensionRegistry);\n    } catch (com.google.protobuf.InvalidProtocolBufferException e) {\n      throw e.setUnfinishedMessage(builder.buildPartial());\n    } catch (com.google.protobuf.UninitializedMessageException e) {\n      throw e.asInvalidProtocolBufferException().setUnfinishedMessage(builder.buildPartial());\n    } catch (java.io.IOException e) {\n      throw new com.google.protobuf.InvalidProtocolBufferException(e)\n          .setUnfinishedMessage(builder.buildPartial());\n    }\n    return builder.buildPartial();\n  }\n};\n\npublic static com.google.protobuf.Parser<$classname$> parser() {\n  return PARSER;\n}\n\n@java.lang.Override\npublic com.google.protobuf.Parser<$classname$> getParserForType() {\n  return PARSER;\n}\n\n"
  ;
  text._M_len = 0x492;
  io::Printer::Print<char[10],std::basic_string_view<char,std::char_traits<char>>>
            (printer,text,(char (*) [10])0x13005f3,&local_10);
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateParser(io::Printer* printer) {
  printer->Print(
      "private static final com.google.protobuf.Parser<$classname$>\n"
      "    PARSER = new com.google.protobuf.AbstractParser<$classname$>() {\n"
      "  @java.lang.Override\n"
      "  public $classname$ parsePartialFrom(\n"
      "      com.google.protobuf.CodedInputStream input,\n"
      "      com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n"
      "      throws com.google.protobuf.InvalidProtocolBufferException {\n"
      "    Builder builder = newBuilder();\n"
      "    try {\n"
      "      builder.mergeFrom(input, extensionRegistry);\n"
      "    } catch (com.google.protobuf.InvalidProtocolBufferException e) {\n"
      "      throw e.setUnfinishedMessage(builder.buildPartial());\n"
      "    } catch (com.google.protobuf.UninitializedMessageException e) {\n"
      "      throw "
      "e.asInvalidProtocolBufferException().setUnfinishedMessage(builder."
      "buildPartial());\n"
      "    } catch (java.io.IOException e) {\n"
      "      throw new com.google.protobuf.InvalidProtocolBufferException(e)\n"
      "          .setUnfinishedMessage(builder.buildPartial());\n"
      "    }\n"
      "    return builder.buildPartial();\n"
      "  }\n"
      "};\n"
      "\n"
      "public static com.google.protobuf.Parser<$classname$> parser() {\n"
      "  return PARSER;\n"
      "}\n"
      "\n"
      "@java.lang.Override\n"
      "public com.google.protobuf.Parser<$classname$> getParserForType() {\n"
      "  return PARSER;\n"
      "}\n"
      "\n",
      "classname", descriptor_->name());
}